

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

void PulseThread(void *Arg)

{
  undefined4 uVar1;
  bool bVar2;
  int retVal;
  UINT32 bufBytes;
  UINT32 didBuffers;
  DRV_PULSE *drv;
  void *Arg_local;
  
  OSSignal_Wait(*(OS_SIGNAL **)((long)Arg + 0x38));
  while (*(char *)((long)Arg + 8) == '\x01') {
    bVar2 = false;
    OSMutex_Lock(*(OS_MUTEX **)((long)Arg + 0x40));
    if ((*(char *)((long)Arg + 0x50) == '\0') && (*(long *)((long)Arg + 0x68) != 0)) {
      uVar1 = (**(code **)((long)Arg + 0x68))
                        (*Arg,*(undefined8 *)((long)Arg + 0x60),*(undefined4 *)((long)Arg + 0x1c),
                         *(undefined8 *)((long)Arg + 0x28));
      pa_simple_write(*(undefined8 *)((long)Arg + 0x48),*(undefined8 *)((long)Arg + 0x28),uVar1,0);
      bVar2 = true;
    }
    OSMutex_Unlock(*(OS_MUTEX **)((long)Arg + 0x40));
    if (!bVar2) {
      usleep(1000);
    }
    while( true ) {
      bVar2 = false;
      if (*(long *)((long)Arg + 0x68) == 0) {
        bVar2 = *(char *)((long)Arg + 8) == '\x01';
      }
      if (!bVar2) break;
      usleep(1000);
    }
  }
  return;
}

Assistant:

static void PulseThread(void* Arg)
{
	DRV_PULSE* drv = (DRV_PULSE*)Arg;
	UINT32 didBuffers;	// number of processed buffers
	UINT32 bufBytes;
	int retVal;
	
	OSSignal_Wait(drv->hSignal);	// wait until the initialization is done
	
	while(drv->devState == 1)
	{
		didBuffers = 0;
		OSMutex_Lock(drv->hMutex);
		if (! drv->pauseThread && drv->FillBuffer != NULL)
		{
			bufBytes = drv->FillBuffer(drv->audDrvPtr, drv->userParam, drv->bufSize, drv->bufSpace);
			retVal = pa_simple_write(drv->hPulse, drv->bufSpace, (size_t) bufBytes, NULL);
			didBuffers ++;
		}
		OSMutex_Unlock(drv->hMutex);
		if (! didBuffers)
			Sleep(1);
		
		while(drv->FillBuffer == NULL && drv->devState == 1)
			Sleep(1);
	}
	
	return;
}